

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O0

XrResult RuntimeInterface::TryLoadingSingleRuntime
                   (string *openxr_command,
                   unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>
                   *manifest_file)

{
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *pvVar1;
  pointer *this;
  bool bVar2;
  ManifestFile *pMVar3;
  string *psVar4;
  char *pcVar5;
  code *pcVar6;
  unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_> *puVar7;
  RuntimeInterface *this_00;
  pointer pRVar8;
  size_type __n;
  reference __src;
  undefined1 local_458 [8];
  XrExtensionProperties ext_prop;
  iterator __end1;
  iterator __begin1;
  vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *__range1;
  vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> extension_properties;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  supported_extensions;
  string local_358;
  string local_338;
  string local_318;
  allocator local_2f1;
  undefined1 local_2f0 [8];
  string info_message;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_2c8;
  string local_2b0;
  allocator local_289;
  undefined1 local_288 [8];
  string warning_message_1;
  allocator local_249;
  undefined1 local_248 [8];
  string error_message_3;
  allocator local_209;
  undefined1 local_208 [8];
  string error_message_2;
  allocator local_1c9;
  undefined1 local_1c8 [8];
  string error_message_1;
  uint32_t loader_major;
  uint32_t runtime_minor;
  uint32_t runtime_major;
  pointer pXStack_190;
  pointer local_188;
  allocator local_171;
  undefined1 local_170 [8];
  string error_message;
  undefined4 local_148;
  XrResult res;
  XrNegotiateRuntimeRequest runtime_info;
  XrNegotiateLoaderInfo loader_info;
  PFN_xrNegotiateLoaderRuntimeInterface negotiate;
  string local_e8;
  undefined1 local_c8 [8];
  string function_name;
  allocator local_81;
  undefined1 local_80 [8];
  string warning_message;
  allocator local_49;
  string local_48 [8];
  string library_message;
  LoaderPlatformLibraryHandle runtime_library;
  unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_> *manifest_file_local;
  string *openxr_command_local;
  
  pMVar3 = &std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>::
            operator->(manifest_file)->super_ManifestFile;
  psVar4 = ManifestFile::LibraryPath_abi_cxx11_(pMVar3);
  library_message.field_2._8_8_ = LoaderPlatformLibraryOpen(psVar4);
  if ((LoaderPlatformLibraryHandle)library_message.field_2._8_8_ == (LoaderPlatformLibraryHandle)0x0
     ) {
    pMVar3 = &std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>::
              operator->(manifest_file)->super_ManifestFile;
    psVar4 = ManifestFile::LibraryPath_abi_cxx11_(pMVar3);
    pcVar5 = LoaderPlatformLibraryOpenError(psVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar5,&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_80,"RuntimeInterface::LoadRuntime skipping manifest file ",&local_81)
    ;
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    pMVar3 = &std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>::
              operator->(manifest_file)->super_ManifestFile;
    psVar4 = ManifestFile::Filename_abi_cxx11_(pMVar3);
    std::__cxx11::string::operator+=((string *)local_80,(string *)psVar4);
    std::__cxx11::string::operator+=((string *)local_80,", failed to load with message \"");
    std::__cxx11::string::operator+=((string *)local_80,local_48);
    std::__cxx11::string::operator+=((string *)local_80,"\"");
    function_name.field_2._8_8_ = 0;
    pvVar1 = (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
             ((long)&function_name.field_2 + 8);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(pvVar1);
    LoaderLogger::LogErrorMessage(openxr_command,(string *)local_80,pvVar1);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
              ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
               ((long)&function_name.field_2 + 8));
    openxr_command_local._4_4_ = XR_ERROR_FILE_ACCESS_ERROR;
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string(local_48);
  }
  else {
    pMVar3 = &std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>::
              operator->(manifest_file)->super_ManifestFile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e8,"xrNegotiateLoaderRuntimeInterface",
               (allocator *)((long)&negotiate + 7));
    psVar4 = ManifestFile::GetFunctionName(pMVar3,&local_e8);
    std::__cxx11::string::string((string *)local_c8,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&negotiate + 7));
    pcVar6 = (code *)LoaderPlatformLibraryGetProcAddr
                               ((LoaderPlatformLibraryHandle)library_message.field_2._8_8_,
                                (string *)local_c8);
    memset(&runtime_info.getInstanceProcAddr,0,0x28);
    runtime_info.getInstanceProcAddr._0_4_ = 1;
    runtime_info.getInstanceProcAddr._4_4_ = 1;
    memset(&local_148,0,0x28);
    local_148 = 3;
    res = XR_TIMEOUT_EXPIRED;
    runtime_info.structType = 0x28;
    runtime_info.structVersion = 0;
    error_message.field_2._12_4_ = 0xfffffffe;
    if (pcVar6 == (code *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_170,
                 "RuntimeInterface::LoadRuntime failed to find negotiate function ",&local_171);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      std::__cxx11::string::operator+=((string *)local_170,(string *)local_c8);
      _runtime_minor = (pointer)0x0;
      pXStack_190 = (pointer)0x0;
      local_188 = (pointer)0x0;
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&runtime_minor);
      LoaderLogger::LogErrorMessage
                (openxr_command,(string *)local_170,
                 (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&runtime_minor);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&runtime_minor);
      std::__cxx11::string::~string((string *)local_170);
    }
    else {
      error_message.field_2._12_4_ = (*pcVar6)(&runtime_info.getInstanceProcAddr,&local_148);
    }
    if (-1 < (int)error_message.field_2._12_4_) {
      error_message_1.field_2._12_4_ = 1;
      if (runtime_info.runtimeApiVersion == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_1c8,"RuntimeInterface::LoadRuntime skipping manifest file ",
                   &local_1c9);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
        pMVar3 = &std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>::
                  operator->(manifest_file)->super_ManifestFile;
        psVar4 = ManifestFile::Filename_abi_cxx11_(pMVar3);
        std::__cxx11::string::operator+=((string *)local_1c8,(string *)psVar4);
        std::__cxx11::string::operator+=
                  ((string *)local_1c8,
                   ", negotiation succeeded but returned NULL getInstanceProcAddr");
        error_message_2.field_2._8_8_ = 0;
        pvVar1 = (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                 ((long)&error_message_2.field_2 + 8);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(pvVar1);
        LoaderLogger::LogErrorMessage(openxr_command,(string *)local_1c8,pvVar1);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                  ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                   ((long)&error_message_2.field_2 + 8));
        error_message.field_2._12_4_ = 0xffffffdf;
        std::__cxx11::string::~string((string *)local_1c8);
      }
      else if (((uint)runtime_info.structSize == 0) || (1 < (uint)runtime_info.structSize)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_208,"RuntimeInterface::LoadRuntime skipping manifest file ",
                   &local_209);
        std::allocator<char>::~allocator((allocator<char> *)&local_209);
        pMVar3 = &std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>::
                  operator->(manifest_file)->super_ManifestFile;
        psVar4 = ManifestFile::Filename_abi_cxx11_(pMVar3);
        std::__cxx11::string::operator+=((string *)local_208,(string *)psVar4);
        std::__cxx11::string::operator+=
                  ((string *)local_208,
                   ", negotiation succeeded but returned invalid interface version");
        error_message_3.field_2._8_8_ = 0;
        pvVar1 = (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                 ((long)&error_message_3.field_2 + 8);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(pvVar1);
        LoaderLogger::LogErrorMessage(openxr_command,(string *)local_208,pvVar1);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                  ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                   ((long)&error_message_3.field_2 + 8));
        error_message.field_2._12_4_ = 0xffffffdf;
        std::__cxx11::string::~string((string *)local_208);
      }
      else if (runtime_info._22_2_ != 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_248,"RuntimeInterface::LoadRuntime skipping manifest file ",
                   &local_249);
        std::allocator<char>::~allocator((allocator<char> *)&local_249);
        pMVar3 = &std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>::
                  operator->(manifest_file)->super_ManifestFile;
        psVar4 = ManifestFile::Filename_abi_cxx11_(pMVar3);
        std::__cxx11::string::operator+=((string *)local_248,(string *)psVar4);
        std::__cxx11::string::operator+=
                  ((string *)local_248,", OpenXR version returned not compatible with this loader");
        warning_message_1.field_2._8_8_ = 0;
        pvVar1 = (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                 ((long)&warning_message_1.field_2 + 8);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(pvVar1);
        LoaderLogger::LogErrorMessage(openxr_command,(string *)local_248,pvVar1);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                  ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                   ((long)&warning_message_1.field_2 + 8));
        error_message.field_2._12_4_ = 0xffffffdf;
        std::__cxx11::string::~string((string *)local_248);
      }
    }
    if ((int)error_message.field_2._12_4_ < 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_288,"RuntimeInterface::LoadRuntime skipping manifest file ",
                 &local_289);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      pMVar3 = &std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>::
                operator->(manifest_file)->super_ManifestFile;
      psVar4 = ManifestFile::Filename_abi_cxx11_(pMVar3);
      std::__cxx11::string::operator+=((string *)local_288,(string *)psVar4);
      std::__cxx11::string::operator+=((string *)local_288,", negotiation failed with error ");
      std::__cxx11::to_string(&local_2b0,error_message.field_2._12_4_);
      std::__cxx11::string::operator+=((string *)local_288,(string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      local_2c8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2c8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2c8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_2c8);
      LoaderLogger::LogErrorMessage(openxr_command,(string *)local_288,&local_2c8);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_2c8);
      LoaderPlatformLibraryClose((LoaderPlatformLibraryHandle)library_message.field_2._8_8_);
      openxr_command_local._4_4_ = error_message.field_2._12_4_;
      info_message.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_288);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_2f0,
                 "RuntimeInterface::LoadRuntime succeeded loading runtime defined in manifest file "
                 ,&local_2f1);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
      pMVar3 = &std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>::
                operator->(manifest_file)->super_ManifestFile;
      psVar4 = ManifestFile::Filename_abi_cxx11_(pMVar3);
      std::__cxx11::string::operator+=((string *)local_2f0,(string *)psVar4);
      std::__cxx11::string::operator+=((string *)local_2f0," using interface version ");
      std::__cxx11::to_string(&local_318,(uint)runtime_info.structSize);
      std::__cxx11::string::operator+=((string *)local_2f0,(string *)&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::operator+=((string *)local_2f0," and OpenXR API version ");
      std::__cxx11::to_string(&local_338,(uint)(ushort)runtime_info._22_2_);
      std::__cxx11::string::operator+=((string *)local_2f0,(string *)&local_338);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::operator+=((string *)local_2f0,".");
      std::__cxx11::to_string(&local_358,(uint)(ushort)runtime_info._20_2_);
      std::__cxx11::string::operator+=((string *)local_2f0,(string *)&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      supported_extensions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this = &supported_extensions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)this);
      LoaderLogger::LogInfoMessage
                (openxr_command,(string *)local_2f0,
                 (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)this);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                 &supported_extensions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      puVar7 = GetInstance();
      this_00 = (RuntimeInterface *)operator_new(0xf0);
      RuntimeInterface(this_00,(LoaderPlatformLibraryHandle)library_message.field_2._8_8_,
                       (PFN_xrGetInstanceProcAddr)runtime_info.runtimeApiVersion);
      std::unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_>::reset
                (puVar7,this_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&extension_properties.
                   super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::vector
                ((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)&__range1)
      ;
      puVar7 = GetInstance();
      pRVar8 = std::unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_>::operator->
                         (puVar7);
      GetInstanceExtensionProperties
                (pRVar8,(vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
                        &__range1);
      __n = std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::size
                      ((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
                       &__range1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&extension_properties.
                    super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__n);
      __end1 = std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::begin
                         ((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
                          &__range1);
      ext_prop._144_8_ =
           std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::end
                     ((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
                      &__range1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<XrExtensionProperties_*,_std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>_>
                                         *)&ext_prop.extensionVersion), bVar2) {
        __src = __gnu_cxx::
                __normal_iterator<XrExtensionProperties_*,_std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>_>
                ::operator*(&__end1);
        memcpy(local_458,__src,0x98);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char(&)[128]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &extension_properties.
                    super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (char (*) [128])&ext_prop.next);
        __gnu_cxx::
        __normal_iterator<XrExtensionProperties_*,_std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>_>
        ::operator++(&__end1);
      }
      puVar7 = GetInstance();
      pRVar8 = std::unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_>::operator->
                         (puVar7);
      SetSupportedExtensions
                (pRVar8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&extension_properties.
                            super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      openxr_command_local._4_4_ = XR_SUCCESS;
      info_message.field_2._12_4_ = 1;
      std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::~vector
                ((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)&__range1)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&extension_properties.
                    super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_2f0);
    }
    std::__cxx11::string::~string((string *)local_c8);
  }
  return openxr_command_local._4_4_;
}

Assistant:

XrResult RuntimeInterface::TryLoadingSingleRuntime(const std::string& openxr_command,
                                                   std::unique_ptr<RuntimeManifestFile>& manifest_file) {
    LoaderPlatformLibraryHandle runtime_library = LoaderPlatformLibraryOpen(manifest_file->LibraryPath());
    if (nullptr == runtime_library) {
        std::string library_message = LoaderPlatformLibraryOpenError(manifest_file->LibraryPath());
        std::string warning_message = "RuntimeInterface::LoadRuntime skipping manifest file ";
        warning_message += manifest_file->Filename();
        warning_message += ", failed to load with message \"";
        warning_message += library_message;
        warning_message += "\"";
        LoaderLogger::LogErrorMessage(openxr_command, warning_message);
        return XR_ERROR_FILE_ACCESS_ERROR;
    }
#ifdef XR_KHR_LOADER_INIT_SUPPORT
    if (!LoaderInitData::instance().initialized()) {
        LoaderLogger::LogErrorMessage(openxr_command, "RuntimeInterface::LoadRuntime skipping manifest file " +
                                                          manifest_file->Filename() +
                                                          " because xrInitializeLoaderKHR was not yet called.");

        LoaderPlatformLibraryClose(runtime_library);
        return XR_ERROR_VALIDATION_FAILURE;
    }
    bool forwardedInitLoader = false;
    {
        // If we have xrInitializeLoaderKHR exposed as an export, forward call to it.
        const auto function_name = manifest_file->GetFunctionName("xrInitializeLoaderKHR");
        auto initLoader =
            reinterpret_cast<PFN_xrInitializeLoaderKHR>(LoaderPlatformLibraryGetProcAddr(runtime_library, function_name));
        if (initLoader != nullptr) {
            // we found the entry point one way or another.
            LoaderLogger::LogInfoMessage(openxr_command,
                                         "RuntimeInterface::LoadRuntime forwarding xrInitializeLoaderKHR call to runtime before "
                                         "calling xrNegotiateLoaderRuntimeInterface.");
            XrResult res = initLoader(LoaderInitData::instance().getParam());
            if (!XR_SUCCEEDED(res)) {
                LoaderLogger::LogErrorMessage(openxr_command,
                                              "RuntimeInterface::LoadRuntime forwarded call to xrInitializeLoaderKHR failed.");

                LoaderPlatformLibraryClose(runtime_library);
                return res;
            }
            forwardedInitLoader = true;
        }
    }
#endif

    // Get and settle on an runtime interface version (using any provided name if required).
    std::string function_name = manifest_file->GetFunctionName("xrNegotiateLoaderRuntimeInterface");
    auto negotiate =
        reinterpret_cast<PFN_xrNegotiateLoaderRuntimeInterface>(LoaderPlatformLibraryGetProcAddr(runtime_library, function_name));

    // Loader info for negotiation
    XrNegotiateLoaderInfo loader_info = {};
    loader_info.structType = XR_LOADER_INTERFACE_STRUCT_LOADER_INFO;
    loader_info.structVersion = XR_LOADER_INFO_STRUCT_VERSION;
    loader_info.structSize = sizeof(XrNegotiateLoaderInfo);
    loader_info.minInterfaceVersion = 1;
    loader_info.maxInterfaceVersion = XR_CURRENT_LOADER_RUNTIME_VERSION;
    loader_info.minApiVersion = XR_MAKE_VERSION(1, 0, 0);
    loader_info.maxApiVersion = XR_MAKE_VERSION(1, 0x3ff, 0xfff);  // Maximum allowed version for this major version.

    // Set up the runtime return structure
    XrNegotiateRuntimeRequest runtime_info = {};
    runtime_info.structType = XR_LOADER_INTERFACE_STRUCT_RUNTIME_REQUEST;
    runtime_info.structVersion = XR_RUNTIME_INFO_STRUCT_VERSION;
    runtime_info.structSize = sizeof(XrNegotiateRuntimeRequest);

    // Skip calling the negotiate function and fail if the function pointer
    // could not get loaded
    XrResult res = XR_ERROR_RUNTIME_FAILURE;
    if (nullptr != negotiate) {
        res = negotiate(&loader_info, &runtime_info);
    } else {
        std::string error_message = "RuntimeInterface::LoadRuntime failed to find negotiate function ";
        error_message += function_name;
        LoaderLogger::LogErrorMessage(openxr_command, error_message);
    }
    // If we supposedly succeeded, but got a nullptr for GetInstanceProcAddr
    // then something still went wrong, so return with an error.
    if (XR_SUCCEEDED(res)) {
        uint32_t runtime_major = XR_VERSION_MAJOR(runtime_info.runtimeApiVersion);
        uint32_t runtime_minor = XR_VERSION_MINOR(runtime_info.runtimeApiVersion);
        uint32_t loader_major = XR_VERSION_MAJOR(XR_CURRENT_API_VERSION);
        if (nullptr == runtime_info.getInstanceProcAddr) {
            std::string error_message = "RuntimeInterface::LoadRuntime skipping manifest file ";
            error_message += manifest_file->Filename();
            error_message += ", negotiation succeeded but returned NULL getInstanceProcAddr";
            LoaderLogger::LogErrorMessage(openxr_command, error_message);
            res = XR_ERROR_FILE_CONTENTS_INVALID;
        } else if (0 >= runtime_info.runtimeInterfaceVersion ||
                   XR_CURRENT_LOADER_RUNTIME_VERSION < runtime_info.runtimeInterfaceVersion) {
            std::string error_message = "RuntimeInterface::LoadRuntime skipping manifest file ";
            error_message += manifest_file->Filename();
            error_message += ", negotiation succeeded but returned invalid interface version";
            LoaderLogger::LogErrorMessage(openxr_command, error_message);
            res = XR_ERROR_FILE_CONTENTS_INVALID;
        } else if (runtime_major != loader_major || (runtime_major == 0 && runtime_minor == 0)) {
            std::string error_message = "RuntimeInterface::LoadRuntime skipping manifest file ";
            error_message += manifest_file->Filename();
            error_message += ", OpenXR version returned not compatible with this loader";
            LoaderLogger::LogErrorMessage(openxr_command, error_message);
            res = XR_ERROR_FILE_CONTENTS_INVALID;
        }
    }
#ifdef XR_KHR_LOADER_INIT_SUPPORT
    if (XR_SUCCEEDED(res) && !forwardedInitLoader) {
        // Forward initialize loader call, where possible and if we did not do so before.
        PFN_xrVoidFunction initializeVoid = nullptr;
        PFN_xrInitializeLoaderKHR initialize = nullptr;

        // Now we may try asking xrGetInstanceProcAddr
        if (XR_SUCCEEDED(runtime_info.getInstanceProcAddr(XR_NULL_HANDLE, "xrInitializeLoaderKHR", &initializeVoid))) {
            if (initializeVoid == nullptr) {
                LoaderLogger::LogErrorMessage(openxr_command,
                                              "RuntimeInterface::LoadRuntime got success from xrGetInstanceProcAddr "
                                              "for xrInitializeLoaderKHR, but output a null pointer.");
                res = XR_ERROR_RUNTIME_FAILURE;
            } else {
                initialize = reinterpret_cast<PFN_xrInitializeLoaderKHR>(initializeVoid);
            }
        }
        if (initialize != nullptr) {
            // we found the entry point one way or another.
            LoaderLogger::LogInfoMessage(openxr_command,
                                         "RuntimeInterface::LoadRuntime forwarding xrInitializeLoaderKHR call to runtime after "
                                         "calling xrNegotiateLoaderRuntimeInterface.");
            res = initialize(LoaderInitData::instance().getParam());
            if (!XR_SUCCEEDED(res)) {
                LoaderLogger::LogErrorMessage(openxr_command,
                                              "RuntimeInterface::LoadRuntime forwarded call to xrInitializeLoaderKHR failed.");
            }
        }
    }
#endif
    if (XR_FAILED(res)) {
        std::string warning_message = "RuntimeInterface::LoadRuntime skipping manifest file ";
        warning_message += manifest_file->Filename();
        warning_message += ", negotiation failed with error ";
        warning_message += std::to_string(res);
        LoaderLogger::LogErrorMessage(openxr_command, warning_message);
        LoaderPlatformLibraryClose(runtime_library);
        return res;
    }

    std::string info_message = "RuntimeInterface::LoadRuntime succeeded loading runtime defined in manifest file ";
    info_message += manifest_file->Filename();
    info_message += " using interface version ";
    info_message += std::to_string(runtime_info.runtimeInterfaceVersion);
    info_message += " and OpenXR API version ";
    info_message += std::to_string(XR_VERSION_MAJOR(runtime_info.runtimeApiVersion));
    info_message += ".";
    info_message += std::to_string(XR_VERSION_MINOR(runtime_info.runtimeApiVersion));
    LoaderLogger::LogInfoMessage(openxr_command, info_message);

    // Use this runtime
    GetInstance().reset(new RuntimeInterface(runtime_library, runtime_info.getInstanceProcAddr));

    // Grab the list of extensions this runtime supports for easy filtering after the
    // xrCreateInstance call
    std::vector<std::string> supported_extensions;
    std::vector<XrExtensionProperties> extension_properties;
    GetInstance()->GetInstanceExtensionProperties(extension_properties);
    supported_extensions.reserve(extension_properties.size());
    for (XrExtensionProperties ext_prop : extension_properties) {
        supported_extensions.emplace_back(ext_prop.extensionName);
    }
    GetInstance()->SetSupportedExtensions(supported_extensions);

    return XR_SUCCESS;
}